

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O2

void build_bb_body(dill_stream c,virtual_insn *insn,int i,virtual_insn *insns)

{
  undefined4 *puVar1;
  byte bVar2;
  char cVar3;
  private_ctx pdVar4;
  void *pvVar5;
  void *pvVar6;
  bit_vec pbVar7;
  int iVar8;
  long lVar9;
  basic_block_conflict bb;
  long lVar10;
  long lVar11;
  
  pdVar4 = c->p;
  pvVar5 = pdVar4->mach_info;
  pvVar6 = *(void **)((long)pvVar5 + 0x10);
  iVar8 = *(int *)((long)pvVar5 + 8);
  lVar9 = (long)iVar8 * 0x68;
  bb = (basic_block_conflict)((long)pvVar6 + lVar9);
  lVar10 = (long)i;
  switch(insn->class_code) {
  case '\0':
  case '\x16':
    bb_uses(c,bb,(insn->opnds).a3.src1);
    iVar8 = (insn->opnds).a3.src2;
    goto LAB_00110178;
  case '\x01':
  case '\x02':
  case '\x04':
  case '\t':
  case '\x15':
    iVar8 = (insn->opnds).a3.src1;
LAB_00110178:
    bb_uses(c,bb,iVar8);
    iVar8 = (insn->opnds).a3.dest;
LAB_00110187:
    bb_defines(c,bb,iVar8);
    goto switchD_0011014b_caseD_a;
  case '\x03':
    iVar8 = (insn->opnds).a3.dest;
    goto LAB_0011037f;
  case '\x05':
    bb_uses(c,bb,(insn->opnds).a3.src1);
    iVar8 = (insn->opnds).a3.src2;
    goto LAB_0011034d;
  case '\x06':
    iVar8 = (insn->opnds).a3.src1;
LAB_0011034d:
    bb_uses(c,bb,iVar8);
    iVar8 = (insn->opnds).a3.dest;
    if ((insn->insn_code & 0x10U) != 0) goto LAB_0011037f;
    goto LAB_00110187;
  case '\a':
  case '\b':
    iVar8 = (insn->opnds).a3.dest;
    goto LAB_00110187;
  default:
    goto switchD_0011014b_caseD_a;
  case '\v':
    bb_uses(c,bb,(insn->opnds).a3.dest);
    bb_uses(c,bb,(insn->opnds).a3.src1);
    iVar8 = (insn->opnds).a3.src2;
    goto LAB_001102a3;
  case '\f':
    bb_uses(c,bb,(insn->opnds).a3.dest);
    iVar8 = (insn->opnds).a3.src1;
LAB_001102a3:
    bb->end_branch_label = iVar8;
    bb->fall_through = 1;
LAB_001102fb:
    bb->end = (long)(i + -1);
    iVar8 = *(int *)((long)pvVar5 + 8);
    *(int *)((long)pvVar5 + 8) = iVar8 + 1;
    pvVar6 = *(void **)((long)pvVar5 + 0x10);
    lVar9 = (long)iVar8 * 0x68;
    break;
  case '\r':
    bb->end_branch_label = (insn->opnds).a3.src2;
    bb->fall_through = 0;
    bb->end = (long)(i + -1);
    *(int *)((long)pvVar5 + 8) = iVar8 + 1;
    break;
  case '\x0f':
    bb_uses(c,bb,(insn->opnds).a3.dest);
    bb->end_branch_label = -1;
    bb->fall_through = 0;
    goto LAB_001102fb;
  case '\x10':
    bb->end_branch_label = -1;
    bb->fall_through = 0;
    bb->end = (long)(i + -1);
    *(int *)((long)pvVar5 + 8) = iVar8 + 1;
    break;
  case '\x11':
    iVar8 = (insn->opnds).a3.dest;
    if ((short)iVar8 < 0) goto switchD_0011014b_caseD_a;
LAB_0011037f:
    bb_uses(c,bb,iVar8);
    goto switchD_0011014b_caseD_a;
  case '\x14':
    bVar2 = insn->insn_code;
    bb->end_branch_label = -1;
    bb->fall_through = 1;
    bb->end = (long)(i + -1);
    *(int *)((long)pvVar5 + 8) = iVar8 + 1;
    pvVar6 = dill_realloc(pvVar6,(long)(iVar8 + 2) * 0x68);
    *(void **)((long)pvVar5 + 0x10) = pvVar6;
    lVar9 = (long)*(int *)((long)pvVar5 + 8) * 0x68;
    *(long *)((long)pvVar6 + lVar9) = lVar10;
    puVar1 = (undefined4 *)((long)pvVar6 + lVar9 + 8);
    *puVar1 = 0xffffffff;
    puVar1[1] = 0xffffffff;
    puVar1[2] = 0xffffffff;
    puVar1[3] = 0xffffffff;
    *(undefined4 *)((long)pvVar6 + lVar9 + 0x18) = 0;
    *(undefined8 *)((long)pvVar6 + lVar9 + 0x5c) = 0;
    bb = (basic_block_conflict)((long)pvVar6 + lVar9);
    pbVar7 = new_bit_vec(c->p->vreg_count);
    *(bit_vec *)((long)pvVar6 + lVar9 + 0x38) = pbVar7;
    pbVar7 = new_bit_vec(c->p->vreg_count);
    *(bit_vec *)((long)pvVar6 + lVar9 + 0x40) = pbVar7;
    if ((bVar2 & 0xf) != 0xb) {
      bb_defines(c,bb,(insn->opnds).a3.dest);
    }
    goto switchD_0011014b_caseD_a;
  }
  pvVar6 = dill_realloc(pvVar6,lVar9 + 0xd0);
  *(void **)((long)pvVar5 + 0x10) = pvVar6;
  lVar9 = (long)*(int *)((long)pvVar5 + 8) * 0x68;
  *(long *)((long)pvVar6 + lVar9) = lVar10;
  puVar1 = (undefined4 *)((long)pvVar6 + lVar9 + 8);
  *puVar1 = 0xffffffff;
  puVar1[1] = 0xffffffff;
  puVar1[2] = 0xffffffff;
  puVar1[3] = 0xffffffff;
  *(undefined4 *)((long)pvVar6 + lVar9 + 0x18) = 0;
  *(undefined8 *)((long)pvVar6 + lVar9 + 0x5c) = 0;
  bb = (basic_block_conflict)((long)pvVar6 + lVar9);
  pbVar7 = new_bit_vec(c->p->vreg_count);
  *(bit_vec *)((long)pvVar6 + lVar9 + 0x38) = pbVar7;
  pbVar7 = new_bit_vec(c->p->vreg_count);
  *(bit_vec *)((long)pvVar6 + lVar9 + 0x40) = pbVar7;
switchD_0011014b_caseD_a:
  for (lVar9 = 0; lVar9 < (pdVar4->branch_table).next_label; lVar9 = lVar9 + 1) {
    if ((long)insn + (0x28 - (long)insns) == (ulong)(uint)(pdVar4->branch_table).label_locs[lVar9])
    {
      if (bb->start != lVar10) {
        cVar3 = insns[i + -1].class_code;
        bb->end_branch_label = -1;
        bb->fall_through = (uint)(cVar3 != '\x03' && cVar3 != '\n');
        bb->end = (long)(i + -1);
        iVar8 = *(int *)((long)pvVar5 + 8);
        *(int *)((long)pvVar5 + 8) = iVar8 + 1;
        pvVar6 = dill_realloc(*(void **)((long)pvVar5 + 0x10),(long)iVar8 * 0x68 + 0xd0);
        *(void **)((long)pvVar5 + 0x10) = pvVar6;
        lVar11 = (long)*(int *)((long)pvVar5 + 8) * 0x68;
        *(long *)((long)pvVar6 + lVar11) = lVar10;
        puVar1 = (undefined4 *)((long)pvVar6 + lVar11 + 8);
        *puVar1 = 0xffffffff;
        puVar1[1] = 0xffffffff;
        puVar1[2] = 0xffffffff;
        puVar1[3] = 0xffffffff;
        *(undefined4 *)((long)pvVar6 + lVar11 + 0x18) = 0;
        *(undefined8 *)((long)pvVar6 + lVar11 + 0x5c) = 0;
        bb = (basic_block_conflict)((long)pvVar6 + lVar11);
        pbVar7 = new_bit_vec(c->p->vreg_count);
        *(bit_vec *)((long)pvVar6 + lVar11 + 0x38) = pbVar7;
        pbVar7 = new_bit_vec(c->p->vreg_count);
        *(bit_vec *)((long)pvVar6 + lVar11 + 0x40) = pbVar7;
      }
      bb->label = (int)lVar9;
    }
  }
  return;
}

Assistant:

static void
build_bb_body(dill_stream c, virtual_insn* insn, int i, virtual_insn* insns)
{
    virtual_mach_info vmi = (virtual_mach_info)c->p->mach_info;
    basic_block bb = &vmi->bblist[vmi->bbcount];
    struct branch_table* t = &c->p->branch_table;
    int j;

    switch (insn->class_code) {
    case iclass_arith3:
    case iclass_compare:
        bb_uses(c, bb, insn->opnds.a3.src1);
        bb_uses(c, bb, insn->opnds.a3.src2);
        bb_defines(c, bb, insn->opnds.a3.dest);
        break;
    case iclass_arith3i:
        bb_uses(c, bb, insn->opnds.a3i.src);
        bb_defines(c, bb, insn->opnds.a3i.dest);
        break;
    case iclass_arith2:
        bb_uses(c, bb, insn->opnds.a2.src);
        bb_defines(c, bb, insn->opnds.a2.dest);
        break;
    case iclass_convert:
        bb_uses(c, bb, insn->opnds.a2.src);
        bb_defines(c, bb, insn->opnds.a2.dest);
        break;
    case iclass_lea:
        bb_uses(c, bb, insn->opnds.a3i.src);
        bb_defines(c, bb, insn->opnds.a3i.dest);
        break;
    case iclass_loadstorei:
        bb_uses(c, bb, insn->opnds.a3i.src);
        if (insn->insn_code & 0x10) {
            /* store */
            bb_uses(c, bb, insn->opnds.a3i.dest);
        } else {
            bb_defines(c, bb, insn->opnds.a3i.dest);
        }
        break;
    case iclass_loadstore:
        bb_uses(c, bb, insn->opnds.a3.src1);
        bb_uses(c, bb, insn->opnds.a3.src2);
        if (insn->insn_code & 0x10) {
            /* store */
            bb_uses(c, bb, insn->opnds.a3.dest);
        } else {
            bb_defines(c, bb, insn->opnds.a3.dest);
        }
        break;
    case iclass_set:
        bb_defines(c, bb, insn->opnds.a3i.dest);
        break;
    case iclass_setf:
        bb_defines(c, bb, insn->opnds.sf.dest);
        break;
    case iclass_mov:
        bb_uses(c, bb, insn->opnds.a2.src);
        bb_defines(c, bb, insn->opnds.a2.dest);
        break;
    case iclass_reti:
        break;
    case iclass_ret:
        bb_uses(c, bb, insn->opnds.a1.src);
        break;
    case iclass_branch:
        bb_uses(c, bb, insn->opnds.br.src1);
        bb_uses(c, bb, insn->opnds.br.src2);
        end_bb(bb, insn->opnds.br.label, 1);
        break;
    case iclass_branchi:
        bb_uses(c, bb, insn->opnds.bri.src);
        end_bb(bb, insn->opnds.bri.label, 1);
        break;
    case iclass_jump_to_label:
        end_bb(bb, insn->opnds.br.label, 0);
        break;
    case iclass_jump_to_reg:
        bb_uses(c, bb, insn->opnds.br.src1);
        end_bb(bb, -1, 0);
        break;
    case iclass_jump_to_imm:
        end_bb(bb, -1, 0);
        break;
    case iclass_call: {
        int typ = insn->insn_code & 0xf;
        end_bb(bb, -1, 1);
        /* put the return register definition in the next bb */
        if (typ != DILL_V) {
            bb_defines(c, bb, insn->opnds.calli.src);
        }
        break;
    }
    case iclass_push:
        if ((short)insn->opnds.a1.src >= 0)
            bb_uses(c, bb, insn->opnds.a1.src);
        break;
    case iclass_special:
        break;
    case iclass_pushi:
        break;
    case iclass_pushf:
        break;
    case iclass_nop:
    case iclass_mark_label:
        break;
    }
    for (j = 0; j < t->next_label; j++) {
        if ((unsigned)t->label_locs[j] ==
            ((char*)insn - (char*)insns) + sizeof(virtual_insn)) {
            int fall_through = 1;
            switch (insns[i - 1].class_code) {
            case iclass_ret:
            case iclass_reti:
                fall_through = 0;
            default:
                break;
            }
            if (bb->start != i) {
                end_bb(bb, -1, fall_through);
            }
            bb->label = j;
        }
    }
}